

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_mul(sexp ctx,sexp a,sexp b)

{
  sexp a_00;
  sexp psVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  double dVar7;
  sexp tmp;
  double local_38;
  sexp local_30;
  sexp_gc_var_t local_28;
  
  if (((ulong)a & 3) == 0) {
    uVar3 = 0;
    if ((ulong)a->tag < 0x11) {
      uVar3 = sexp_number_types[a->tag];
    }
  }
  else {
    uVar3 = (uint)a & 1;
  }
  if (((ulong)b & 3) == 0) {
    uVar5 = 0;
    if ((ulong)b->tag < 0x11) {
      uVar5 = sexp_number_types[b->tag];
    }
  }
  else {
    uVar5 = (uint)b & 1;
  }
  local_28.var = &local_30;
  local_30 = (sexp)&DAT_0000043e;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  psVar1 = a;
  a_00 = b;
  uVar4 = uVar3;
  if ((int)uVar3 <= (int)uVar5) {
    psVar1 = (sexp)&DAT_0000043e;
    a_00 = a;
    a = b;
    uVar4 = uVar5;
    uVar5 = uVar3;
  }
  uVar4 = uVar4 + uVar5 * 6;
  if (0x23 < uVar4) goto switchD_0011941c_caseD_5;
  lVar6 = (long)a_00 >> 1;
  switch(uVar4) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
    psVar1 = sexp_type_exception(ctx,(sexp)0x0,3,a_00);
    break;
  case 7:
    uVar2 = lVar6 * ((long)a >> 1);
    if (SUB168(SEXT816(lVar6) * SEXT816((long)a >> 1),8) + (ulong)(0xbfffffffffffffff < uVar2) <
        (ulong)(uVar2 + 0x4000000000000000 < 0x8000000000000000)) {
      psVar1 = (sexp)(uVar2 * 2 + 1);
    }
    else {
      local_30 = sexp_fixnum_to_bignum(ctx,a_00);
      psVar1 = sexp_mul(ctx,local_30,a);
    }
    break;
  case 8:
    if (a_00 == (sexp)&DAT_00000001) {
      psVar1 = (sexp)&DAT_00000001;
      break;
    }
    dVar7 = (double)lVar6;
    goto LAB_00119575;
  case 9:
    uVar2 = (ulong)a_00 >> 1;
    if ((long)a_00 < 0) {
      uVar2 = -lVar6;
    }
    psVar1 = sexp_bignum_fxmul(ctx,(sexp)0x0,a,uVar2,0);
    (psVar1->value).flonum_bits[0] = (a->value).flonum_bits[0] * ((byte)((long)a_00 >> 0x3f) | 1);
    goto LAB_0011954e;
  case 10:
  case 0x16:
    a_00 = sexp_make_ratio(ctx,a_00,(sexp)&DAT_00000003);
    local_30 = a_00;
  case 0x1c:
    psVar1 = sexp_ratio_mul(ctx,a_00,a);
    break;
  case 0xb:
  case 0x11:
  case 0x17:
  case 0x1d:
    a_00 = sexp_make_complex(ctx,a_00,(sexp)&DAT_00000001);
    local_30 = a_00;
  case 0x23:
    psVar1 = sexp_complex_mul(ctx,a_00,a);
    break;
  case 0xe:
    dVar7 = (a_00->value).flonum;
LAB_00119575:
    dVar7 = dVar7 * (a->value).flonum;
LAB_0011957b:
    psVar1 = sexp_make_flonum(ctx,dVar7);
    break;
  case 0xf:
    local_38 = (a_00->value).flonum;
    dVar7 = sexp_bignum_to_double(a);
    goto LAB_00119568;
  case 0x10:
    local_38 = (a_00->value).flonum;
    dVar7 = sexp_ratio_to_double(ctx,a);
LAB_00119568:
    dVar7 = dVar7 * local_38;
    goto LAB_0011957b;
  case 0x15:
    psVar1 = sexp_bignum_mul(ctx,(sexp)0x0,a_00,a);
LAB_0011954e:
    psVar1 = sexp_bignum_normalize(psVar1);
  }
switchD_0011941c_caseD_5:
  (ctx->value).context.saves = local_28.next;
  return psVar1;
}

Assistant:

sexp sexp_mul (sexp ctx, sexp a, sexp b) {
  sexp_lsint_t prod;
  int at=sexp_number_type(a), bt=sexp_number_type(b), t;
  sexp r=SEXP_VOID;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  if (at > bt) {r=a; a=b; b=r; t=at; at=bt; bt=t;}
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_NOT_RAT:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
    break;
  case SEXP_NUM_FIX_FIX:
    prod = lsint_mul_sint(lsint_from_sint(sexp_unbox_fixnum(a)), sexp_unbox_fixnum(b));
    if (!lsint_is_fixnum(prod))
      r = sexp_mul(ctx, tmp=sexp_fixnum_to_bignum(ctx, a), b);
    else
      r = sexp_make_fixnum(lsint_to_sint(prod));
    break;
  case SEXP_NUM_FIX_FLO:
    r = (a==SEXP_ZERO ? a : sexp_make_flonum(ctx, sexp_fixnum_to_double(a)*sexp_flonum_value(b)));
    break;
  case SEXP_NUM_FIX_BIG:
    r = sexp_bignum_fxmul(ctx, NULL, b, sexp_unbox_fx_abs(a), 0);
    sexp_bignum_sign(r) = sexp_fx_sign(a) * sexp_bignum_sign(b);
    r = sexp_bignum_normalize(r);
    break;
  case SEXP_NUM_FLO_FLO:
    r = sexp_fp_mul(ctx, a, b);
    break;
  case SEXP_NUM_FLO_BIG:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) * sexp_bignum_to_double(b));
    break;
  case SEXP_NUM_BIG_BIG:
    r = sexp_bignum_normalize(sexp_bignum_mul(ctx, NULL, a, b));
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) * sexp_ratio_to_double(ctx, b));
    break;
  case SEXP_NUM_FIX_RAT:
  case SEXP_NUM_BIG_RAT:
    a = tmp = sexp_make_ratio(ctx, a, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_RAT_RAT:
    r = sexp_ratio_mul(ctx, a, b);
    break;
#endif
#if SEXP_USE_COMPLEX
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_CPX:
#endif
  case SEXP_NUM_FLO_CPX:
  case SEXP_NUM_FIX_CPX:
  case SEXP_NUM_BIG_CPX:
    a = tmp = sexp_make_complex(ctx, a, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_CPX_CPX:
    r = sexp_complex_mul(ctx, a, b);
    break;
#endif
  }
  sexp_gc_release1(ctx);
  return r;
}